

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O1

void sub0_sock_init(void *arg,nni_sock *unused)

{
  nni_list_init_offset((nni_list *)((long)arg + 0xa8),0);
  nni_mtx_init((nni_mtx *)((long)arg + 0xd8));
  *(undefined8 *)((long)arg + 200) = 0x80;
  *(undefined1 *)((long)arg + 0xd0) = 1;
  nni_pollable_init((nni_pollable *)arg);
  sub0_ctx_init((void *)((long)arg + 0x10),arg);
  return;
}

Assistant:

static void
sub0_sock_init(void *arg, nni_sock *unused)
{
	sub0_sock *sock = arg;

	NNI_ARG_UNUSED(unused);

	NNI_LIST_INIT(&sock->contexts, sub0_ctx, node);
	nni_mtx_init(&sock->lk);
	sock->recv_buf_len = SUB0_DEFAULT_RECV_BUF_LEN;
	sock->prefer_new   = SUB0_DEFAULT_PREFER_NEW;
	nni_pollable_init(&sock->readable);

	sub0_ctx_init(&sock->master, sock);
}